

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar32 u_unescapeAt_63(UNESCAPE_CHAR_AT charAt,int32_t *offset,int32_t length,void *context)

{
  bool bVar1;
  UNESCAPE_CHAR_AT charAt_00;
  void *context_00;
  UChar UVar2;
  UChar UVar3;
  uint uVar4;
  UChar32 UVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  bool bVar12;
  int32_t ahead;
  int local_58;
  int local_54;
  sbyte local_50;
  int local_4c;
  UNESCAPE_CHAR_AT local_48;
  void *local_40;
  ulong local_38;
  
  uVar11 = *offset;
  uVar6 = (ulong)uVar11;
  if (length <= (int)uVar11 || (int)uVar11 < 0) goto LAB_0018a8d4;
  *offset = uVar11 + 1;
  UVar2 = (*charAt)(uVar11,context);
  local_54 = 8;
  local_50 = 4;
  local_48 = charAt;
  local_40 = context;
  local_38 = uVar6;
  if (UVar2 == L'U') {
    bVar12 = true;
    local_58 = 8;
LAB_0018a6ed:
    local_50 = 4;
    bVar1 = false;
    bVar10 = 0;
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)(ushort)UVar2;
    if (uVar8 == 0x75) {
      bVar12 = true;
      local_54 = 4;
      local_58 = 4;
      goto LAB_0018a6ed;
    }
    if (uVar8 == 0x78) {
      bVar12 = true;
      UVar2 = L'x';
      bVar1 = false;
      if (*offset < length) {
        local_58 = 1;
        UVar3 = (*charAt)(*offset,context);
        UVar2 = L'x';
        if (UVar3 == L'{') {
          *offset = *offset + 1;
          bVar12 = false;
        }
        else {
          local_54 = 2;
        }
        goto LAB_0018a6ed;
      }
      local_58 = 1;
      local_54 = 2;
      bVar10 = 0;
      uVar8 = 0;
    }
    else {
      uVar11 = 0xff;
      if ((UVar2 & 0xfff8U) == 0x30) {
        uVar11 = (ushort)UVar2 - 0x30 & 0xff;
      }
      if ((char)uVar11 < '\0') {
        uVar6 = 0;
        do {
          if (UVar2 == L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar6]) {
            return (uint)(ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar6 + 1];
          }
        } while (((ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar6] <= (ushort)UVar2) &&
                (bVar12 = uVar6 < 0xe, uVar6 = uVar6 + 2, bVar12));
        if (UVar2 == L'c') {
          iVar7 = *offset;
          if (length <= iVar7) {
            return 99;
          }
          *offset = iVar7 + 1;
          UVar2 = (*charAt)(iVar7,context);
          uVar11 = (uint)(ushort)UVar2;
          if (((UVar2 & 0xfc00U) == 0xd800) && (*offset < length)) {
            UVar2 = (*charAt)(*offset,context);
            if ((UVar2 & 0xfc00U) == 0xdc00) {
              *offset = *offset + 1;
              uVar11 = (ushort)UVar2 + 0x2400;
            }
          }
          return uVar11 & 0x1f;
        }
        if ((UVar2 & 0xfc00U) != 0xd800) {
          return uVar8;
        }
        if (length <= *offset) {
          return uVar8;
        }
        UVar2 = (*charAt)(*offset,context);
        uVar11 = (uint)(ushort)UVar2;
        if ((uVar11 & 0xfc00) != 0xdc00) {
          return uVar8;
        }
        *offset = *offset + 1;
        goto LAB_0018a953;
      }
      bVar12 = true;
      local_58 = 1;
      local_50 = 3;
      bVar1 = true;
      local_54 = 3;
      bVar10 = 1;
      uVar8 = uVar11;
    }
  }
  iVar7 = *offset;
  uVar9 = (uint)bVar10;
  if (iVar7 < length) {
    uVar11 = (uint)(byte)(bVar10 + 1);
    uVar9 = (uint)bVar10;
    do {
      UVar2 = (*local_48)(iVar7,local_40);
      uVar4 = (uint)(ushort)UVar2;
      if (bVar1) {
        if (((UVar2 & 0xfff8U) != 0x30) || ((char)UVar2 < '0')) break;
        uVar4 = uVar4 - 0x30;
      }
      else if ((ushort)(UVar2 + L'￐') < 10) {
        uVar4 = uVar4 - 0x30;
      }
      else if ((ushort)(UVar2 + L'﾿') < 6) {
        uVar4 = uVar4 - 0x37;
      }
      else {
        if (5 < (ushort)(UVar2 + L'ﾟ')) break;
        uVar4 = uVar4 - 0x57;
      }
      uVar8 = uVar8 << local_50 | uVar4 & 0xff;
      iVar7 = *offset + 1;
      *offset = iVar7;
      uVar9 = (uint)(char)uVar11;
      if ((length <= iVar7) || (uVar11 = uVar9 + 1, local_54 <= (int)uVar9)) break;
    } while( true );
  }
  context_00 = local_40;
  charAt_00 = local_48;
  uVar11 = (uint)local_38;
  if (local_58 <= (int)uVar9) {
    if (!bVar12) {
      if (UVar2 != L'}') goto LAB_0018a8d4;
      *offset = *offset + 1;
    }
    if (uVar8 < 0x110000) {
      iVar7 = *offset;
      if (length <= iVar7) {
        return uVar8;
      }
      if ((uVar8 & 0x1ffc00) != 0xd800) {
        return uVar8;
      }
      local_4c = iVar7 + 1;
      UVar2 = (*local_48)(iVar7,local_40);
      if (iVar7 + 1 < length && UVar2 == L'\\') {
        UVar5 = u_unescapeAt_63(charAt_00,&local_4c,length,context_00);
        UVar2 = (UChar)UVar5;
      }
      uVar11 = (uint)(ushort)UVar2;
      if ((UVar2 & 0xfc00U) != 0xdc00) {
        return uVar8;
      }
      *offset = local_4c;
LAB_0018a953:
      return uVar8 * 0x400 + uVar11 + -0x35fdc00;
    }
  }
LAB_0018a8d4:
  *offset = uVar11;
  return -1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_unescapeAt(UNESCAPE_CHAR_AT charAt,
             int32_t *offset,
             int32_t length,
             void *context) {

    int32_t start = *offset;
    UChar c;
    UChar32 result = 0;
    int8_t n = 0;
    int8_t minDig = 0;
    int8_t maxDig = 0;
    int8_t bitsPerDigit = 4; 
    int8_t dig;
    int32_t i;
    UBool braces = FALSE;

    /* Check that offset is in range */
    if (*offset < 0 || *offset >= length) {
        goto err;
    }

    /* Fetch first UChar after '\\' */
    c = charAt((*offset)++, context);

    /* Convert hexadecimal and octal escapes */
    switch (c) {
    case 0x0075 /*'u'*/:
        minDig = maxDig = 4;
        break;
    case 0x0055 /*'U'*/:
        minDig = maxDig = 8;
        break;
    case 0x0078 /*'x'*/:
        minDig = 1;
        if (*offset < length && charAt(*offset, context) == 0x7B /*{*/) {
            ++(*offset);
            braces = TRUE;
            maxDig = 8;
        } else {
            maxDig = 2;
        }
        break;
    default:
        dig = _digit8(c);
        if (dig >= 0) {
            minDig = 1;
            maxDig = 3;
            n = 1; /* Already have first octal digit */
            bitsPerDigit = 3;
            result = dig;
        }
        break;
    }
    if (minDig != 0) {
        while (*offset < length && n < maxDig) {
            c = charAt(*offset, context);
            dig = (int8_t)((bitsPerDigit == 3) ? _digit8(c) : _digit16(c));
            if (dig < 0) {
                break;
            }
            result = (result << bitsPerDigit) | dig;
            ++(*offset);
            ++n;
        }
        if (n < minDig) {
            goto err;
        }
        if (braces) {
            if (c != 0x7D /*}*/) {
                goto err;
            }
            ++(*offset);
        }
        if (result < 0 || result >= 0x110000) {
            goto err;
        }
        /* If an escape sequence specifies a lead surrogate, see if
         * there is a trail surrogate after it, either as an escape or
         * as a literal.  If so, join them up into a supplementary.
         */
        if (*offset < length && U16_IS_LEAD(result)) {
            int32_t ahead = *offset + 1;
            c = charAt(*offset, context);
            if (c == 0x5C /*'\\'*/ && ahead < length) {
                c = (UChar) u_unescapeAt(charAt, &ahead, length, context);
            }
            if (U16_IS_TRAIL(c)) {
                *offset = ahead;
                result = U16_GET_SUPPLEMENTARY(result, c);
            }
        }
        return result;
    }

    /* Convert C-style escapes in table */
    for (i=0; i<UNESCAPE_MAP_LENGTH; i+=2) {
        if (c == UNESCAPE_MAP[i]) {
            return UNESCAPE_MAP[i+1];
        } else if (c < UNESCAPE_MAP[i]) {
            break;
        }
    }

    /* Map \cX to control-X: X & 0x1F */
    if (c == 0x0063 /*'c'*/ && *offset < length) {
        c = charAt((*offset)++, context);
        if (U16_IS_LEAD(c) && *offset < length) {
            UChar c2 = charAt(*offset, context);
            if (U16_IS_TRAIL(c2)) {
                ++(*offset);
                c = (UChar) U16_GET_SUPPLEMENTARY(c, c2); /* [sic] */
            }
        }
        return 0x1F & c;
    }

    /* If no special forms are recognized, then consider
     * the backslash to generically escape the next character.
     * Deal with surrogate pairs. */
    if (U16_IS_LEAD(c) && *offset < length) {
        UChar c2 = charAt(*offset, context);
        if (U16_IS_TRAIL(c2)) {
            ++(*offset);
            return U16_GET_SUPPLEMENTARY(c, c2);
        }
    }
    return c;

 err:
    /* Invalid escape sequence */
    *offset = start; /* Reset to initial value */
    return (UChar32)0xFFFFFFFF;
}